

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::detail::ResultBuilder::binary_assert<0,std::__cxx11::string,char[6]>
          (ResultBuilder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,char (*rhs) [6])

{
  int iVar1;
  ContextOptions *pCVar2;
  char (*in_R8) [6];
  String SStack_38;
  
  iVar1 = std::__cxx11::string::compare((char *)lhs);
  (this->super_AssertData).m_failed = iVar1 != 0;
  if ((iVar1 == 0) && (pCVar2 = getContextOptions(), pCVar2->success != true)) {
    return;
  }
  stringifyBinaryExpr<std::__cxx11::string,char[6]>
            (&SStack_38,(detail *)lhs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1bc83a,*rhs,
             in_R8);
  String::operator=(&(this->super_AssertData).m_decomp,&SStack_38);
  String::~String(&SStack_38);
  return;
}

Assistant:

DOCTEST_NOINLINE void binary_assert(const DOCTEST_REF_WRAP(L) lhs,
                                            const DOCTEST_REF_WRAP(R) rhs) {
            m_failed = !RelationalComparator<comparison, L, R>()(lhs, rhs);
            if(m_failed || getContextOptions()->success)
                m_decomp = stringifyBinaryExpr(lhs, ", ", rhs);
        }